

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall ParserTest::AssertParse(ParserTest *this,char *input)

{
  Test *pTVar1;
  bool bVar2;
  allocator<char> local_c1;
  string err;
  string local_a0;
  ManifestParser parser;
  
  ManifestParser::ManifestParser
            (&parser,&this->state,(FileReader *)&this->fs_,(ManifestParserOptions)0x0);
  pTVar1 = g_current_test;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,input,&local_c1);
  bVar2 = ManifestParser::ParseTest(&parser,&local_a0,&err);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x1e,"parser.ParseTest(input, &err)");
  std::__cxx11::string::~string((string *)&local_a0);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",&err);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                     ,0x1f,"\"\" == err");
  if (bVar2) {
    VerifyGraph(&this->state);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  std::__cxx11::string::~string((string *)&err);
  return;
}

Assistant:

void AssertParse(const char* input) {
    ManifestParser parser(&state, &fs_);
    string err;
    EXPECT_TRUE(parser.ParseTest(input, &err));
    ASSERT_EQ("", err);
    VerifyGraph(state);
  }